

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall
llvm::FoldingSetIteratorImpl::FoldingSetIteratorImpl(FoldingSetIteratorImpl *this,void **Bucket)

{
  Node *pNVar1;
  bool bVar2;
  void **local_18;
  void **Bucket_local;
  FoldingSetIteratorImpl *this_local;
  
  local_18 = Bucket;
  while( true ) {
    bVar2 = false;
    if ((*local_18 != (void *)0xffffffffffffffff) && (bVar2 = true, *local_18 != (void *)0x0)) {
      pNVar1 = GetNextPtr(*local_18);
      bVar2 = pNVar1 == (Node *)0x0;
    }
    if (!bVar2) break;
    local_18 = local_18 + 1;
  }
  this->NodePtr = (FoldingSetNode *)*local_18;
  return;
}

Assistant:

FoldingSetIteratorImpl::FoldingSetIteratorImpl(void **Bucket) {
  // Skip to the first non-null non-self-cycle bucket.
  while (*Bucket != reinterpret_cast<void*>(-1) &&
         (!*Bucket || !GetNextPtr(*Bucket)))
    ++Bucket;

  NodePtr = static_cast<FoldingSetNode*>(*Bucket);
}